

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_json_simple_strcmp(char *buf,size_t len,char *name,char *comp)

{
  char *pcVar1;
  char *__s1;
  char *pcVar2;
  char *hit;
  size_t al;
  char *comp_local;
  char *name_local;
  size_t len_local;
  char *buf_local;
  
  al = (size_t)comp;
  comp_local = name;
  name_local = (char *)len;
  len_local = (size_t)buf;
  __s1 = lws_json_simple_find(buf,len,name,(size_t *)&hit);
  pcVar1 = hit;
  if (__s1 == (char *)0x0) {
    buf_local._4_4_ = -1;
  }
  else {
    pcVar2 = (char *)strlen((char *)al);
    if (pcVar1 == pcVar2) {
      buf_local._4_4_ = strncmp(__s1,(char *)al,(size_t)hit);
    }
    else {
      buf_local._4_4_ = -1;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
lws_json_simple_strcmp(const char *buf, size_t len, const char *name,
		       const char *comp)
{
	size_t al;
	const char *hit = lws_json_simple_find(buf, len, name, &al);

	if (!hit)
		return -1;

	if (al != strlen(comp))
		return -1;

	return strncmp(hit, comp, al);
}